

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

size_t duckdb_je_batch_alloc(void **ptrs,size_t num,size_t size,int flags)

{
  uint64_t *puVar1;
  tcache_t *tcache_00;
  uint64_t *puVar2;
  uint64_t uVar3;
  arena_t *paVar4;
  long lVar5;
  bool bVar6;
  tcaches_t *ptVar7;
  _Bool zero;
  uint ind;
  uint uVar8;
  uint uVar9;
  uint binind;
  tsd_t *tsd;
  ulong uVar10;
  size_t sVar11;
  void *pvVar12;
  anon_union_8_2_150e8edc_for_tcaches_s_0 aVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  cache_bin_t *pcVar18;
  cache_bin_t *pcVar19;
  size_t sVar20;
  size_t i;
  void **ppvVar21;
  ulong uVar22;
  size_t size_00;
  tcache_t *tcache;
  tcache_slow_t *tcache_slow;
  arena_t *local_d8;
  ulong local_c8;
  te_ctx_t local_58;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_02494380);
  if (((tsd->state).repr != '\0') &&
     (tsd = duckdb_je_tsd_fetch_slow(tsd,false), tsd == (tsd_t *)0x0)) {
    return 0;
  }
  if ('\0' < tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level) {
    return 0;
  }
  uVar10 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  if (uVar10 == 0) {
    if (size < 0x1001) {
      size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) {
        return 0;
      }
      uVar10 = size * 2 - 1;
      lVar5 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      uVar10 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
      size_00 = ~uVar10 + size & uVar10;
    }
  }
  else {
    if (uVar10 < 0x1001 && size < 0x3801) {
      uVar15 = -uVar10 & (size + uVar10) - 1;
      if (uVar15 < 0x1001) {
        size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar15 + 7 >> 3]];
      }
      else {
        uVar17 = uVar15 * 2 - 1;
        lVar5 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar17 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
        size_00 = ~uVar17 + uVar15 & uVar17;
      }
      uVar15 = 0x4000;
      if (size_00 < 0x4000) goto LAB_01d4d891;
    }
    else {
      if (0x7000000000000000 < uVar10) {
        return 0;
      }
      uVar15 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar15 = size * 2 - 1;
          lVar5 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          uVar15 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
          uVar15 = ~uVar15 + size & uVar15;
        }
        else {
          uVar15 = 0;
        }
        if (uVar15 < size) {
          return 0;
        }
      }
    }
    size_00 = 0;
    if (uVar15 <= (duckdb_je_sz_large_pad + (uVar10 + 0xfff & 0x7ffffffffffff000) + uVar15) - 0x1000
       ) {
      size_00 = uVar15;
    }
  }
LAB_01d4d891:
  if (size_00 + 0x8fffffffffffffff < 0x9000000000000000) {
    return 0;
  }
  if (size_00 < 0x1001) {
    binind = (uint)duckdb_je_sz_size2index_tab[size_00 + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(size_00);
  }
  if (binind < 0x24) {
    local_c8 = (ulong)duckdb_je_bin_infos[binind].nregs;
  }
  else {
    local_c8 = 0;
  }
  zero = (_Bool)((byte)((flags & 0x40U) >> 6) | duckdb_je_opt_zero);
  ind = ((uint)flags >> 0x14) - 1;
  tcache_00 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  uVar8 = flags & 0xfff00;
  uVar14 = uVar8 >> 8;
  uVar10 = (ulong)(uVar14 - 2);
  puVar2 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
  puVar1 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
  local_d8 = (arena_t *)0x0;
  pcVar19 = (cache_bin_t *)0x0;
  sVar20 = 0;
  do {
    uVar15 = num - sVar20;
    if (num < sVar20 || uVar15 == 0) {
      return sVar20;
    }
    if ((binind < 0x24) && (local_c8 <= uVar15)) {
      if (local_d8 != (arena_t *)0x0) {
LAB_01d4da36:
        sVar11 = duckdb_je_arena_fill_small_fresh
                           ((tsdn_t *)tsd,local_d8,binind,ptrs + sVar20,uVar15 - uVar15 % local_c8,
                            zero);
        sVar20 = sVar20 + sVar11;
        goto LAB_01d4da8b;
      }
      if (0xfffff < (uint)flags) {
        local_d8 = (arena_t *)duckdb_je_arenas[ind].repr;
        if (local_d8 == (arena_t *)0x0) {
          local_d8 = duckdb_je_arena_init((tsdn_t *)tsd,ind,&duckdb_je_arena_config_default);
        }
        if (local_d8 != (arena_t *)0x0) goto LAB_01d4da36;
        if (duckdb_je_narenas_auto <= ind) {
          return sVar20;
        }
      }
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        local_d8 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
        if (local_d8 != (arena_t *)0x0) goto LAB_01d4da36;
        local_d8 = duckdb_je_arena_choose_hard(tsd,false);
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
          paVar4 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
          if (paVar4 == (arena_t *)0x0) {
            duckdb_je_tcache_arena_associate
                      ((tsdn_t *)tsd,
                       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                       tcache_00,local_d8);
          }
          else if (paVar4 != local_d8) {
            duckdb_je_tcache_arena_reassociate
                      ((tsdn_t *)tsd,
                       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                       tcache_00,local_d8);
          }
        }
      }
      else {
        local_d8 = (arena_t *)duckdb_je_arenas[0].repr;
        if (duckdb_je_arenas[0].repr == (void *)0x0) {
          local_d8 = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
        }
      }
      if (local_d8 != (arena_t *)0x0) goto LAB_01d4da36;
      local_d8 = (arena_t *)0x0;
      bVar6 = false;
    }
    else {
      sVar11 = 0;
LAB_01d4da8b:
      ptVar7 = duckdb_je_tcaches;
      if (uVar8 == 0) {
LAB_01d4da96:
        aVar13.tcache = tcache_00;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
LAB_01d4daa6:
          if (((binind < (aVar13.tcache)->tcache_slow->tcache_nbins) &&
              ((aVar13.tcache)->bins[binind].stack_head != (void **)&duckdb_je_disabled_bin)) &&
             (uVar17 = uVar15 - sVar11, sVar11 <= uVar15 && uVar17 != 0)) {
            pcVar18 = (aVar13.tcache)->bins + binind;
            if (pcVar19 != (cache_bin_t *)0x0) {
              pcVar18 = pcVar19;
            }
            uVar9 = (*(int *)&pcVar18->low_bits_empty - (int)pcVar18->stack_head & 0xffffU) >> 3;
            uVar16 = (uint)uVar17;
            if (uVar9 <= uVar17) {
              uVar16 = uVar9;
            }
            uVar17 = (ulong)(uVar16 & 0xffff);
            uVar22 = (ulong)((uVar16 & 0xffff) * 8);
            switchD_012b9b0d::default(ptrs + sVar20,pcVar18->stack_head,uVar22);
            ppvVar21 = (void **)(uVar22 + (long)pcVar18->stack_head);
            pcVar18->stack_head = ppvVar21;
            if ((ushort)((*(int *)&pcVar18->low_bits_empty - (int)ppvVar21 & 0xffffU) >> 3) <
                (ushort)((short)*(int *)&pcVar18->low_bits_empty - pcVar18->low_bits_low_water) >> 3
               ) {
              pcVar18->low_bits_low_water = (uint16_t)ppvVar21;
            }
            (pcVar18->tstats).nrequests = (pcVar18->tstats).nrequests + uVar17;
            if (zero == true && uVar17 != 0) {
              uVar22 = 0;
              do {
                switchD_012e3010::default((ptrs + sVar20)[uVar22],0,size_00);
                uVar22 = uVar22 + 1;
              } while (uVar17 != uVar22);
            }
            sVar11 = sVar11 + uVar17;
            sVar20 = sVar20 + uVar17;
            pcVar19 = pcVar18;
          }
        }
      }
      else if ((uVar8 != 0x100) && (uVar14 != 1)) {
        if (uVar14 == 0) goto LAB_01d4da96;
        aVar13 = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[uVar10].field_0.tcache;
        if (aVar13 == (tcache_t *)0x0) {
          duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n",uVar10);
          abort();
        }
        if (aVar13 == (tcache_t *)&DAT_00000001) {
          aVar13.tcache = duckdb_je_tcache_create_explicit(tsd);
          ptVar7[uVar10].field_0.tcache = (tcache_t *)aVar13;
        }
        if (aVar13.tcache == (tcache_t *)0x0) goto LAB_01d4dbfe;
        goto LAB_01d4daa6;
      }
LAB_01d4dbfe:
      local_58.is_alloc = true;
      uVar3 = *puVar2;
      *puVar2 = uVar3 + sVar11 * size_00;
      local_58.current = puVar2;
      local_58.last_event =
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
      local_58.next_event = puVar1;
      local_58.next_event_fast =
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
      if (*puVar1 - uVar3 <= sVar11 * size_00) {
        duckdb_je_te_event_trigger(tsd,&local_58);
      }
      bVar6 = true;
      if (sVar11 < uVar15) {
        pvVar12 = duckdb_je_mallocx(size,flags);
        if (pvVar12 == (void *)0x0) {
          return sVar20;
        }
        ptrs[sVar20] = pvVar12;
        sVar20 = sVar20 + 1;
      }
    }
    if (!bVar6) {
      return sVar20;
    }
  } while( true );
}

Assistant:

size_t
batch_alloc(void **ptrs, size_t num, size_t size, int flags) {
	LOG("core.batch_alloc.entry",
	    "ptrs: %p, num: %zu, size: %zu, flags: %d", ptrs, num, size, flags);

	tsd_t *tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	size_t filled = 0;

	if (unlikely(tsd == NULL || tsd_reentrancy_level_get(tsd) > 0)) {
		goto label_done;
	}

	size_t alignment = MALLOCX_ALIGN_GET(flags);
	size_t usize;
	if (aligned_usize_get(size, alignment, &usize, NULL, false)) {
		goto label_done;
	}
	szind_t ind = sz_size2index(usize);
	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	/*
	 * The cache bin and arena will be lazily initialized; it's hard to
	 * know in advance whether each of them needs to be initialized.
	 */
	cache_bin_t *bin = NULL;
	arena_t *arena = NULL;

	size_t nregs = 0;
	if (likely(ind < SC_NBINS)) {
		nregs = bin_infos[ind].nregs;
		assert(nregs > 0);
	}

	while (filled < num) {
		size_t batch = num - filled;
		size_t surplus = SIZE_MAX; /* Dead store. */
		bool prof_sample_event = config_prof && opt_prof
		    && prof_active_get_unlocked()
		    && te_prof_sample_event_lookahead_surplus(tsd,
		    batch * usize, &surplus);

		if (prof_sample_event) {
			/*
			 * Adjust so that the batch does not trigger prof
			 * sampling.
			 */
			batch -= surplus / usize + 1;
			batch_alloc_prof_sample_assert(tsd, batch, usize);
		}

		size_t progress = 0;

		if (likely(ind < SC_NBINS) && batch >= nregs) {
			if (arena == NULL) {
				unsigned arena_ind = mallocx_arena_get(flags);
				if (arena_get_from_ind(tsd, arena_ind,
				    &arena)) {
					goto label_done;
				}
				if (arena == NULL) {
					arena = arena_choose(tsd, NULL);
				}
				if (unlikely(arena == NULL)) {
					goto label_done;
				}
			}
			size_t arena_batch = batch - batch % nregs;
			size_t n = arena_fill_small_fresh(tsd_tsdn(tsd), arena,
			    ind, ptrs + filled, arena_batch, zero);
			progress += n;
			filled += n;
		}

		unsigned tcache_ind = mallocx_tcache_get(flags);
		tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind,
		    /* slow */ true, /* is_alloc */ true);
		if (likely(tcache != NULL &&
		    ind < tcache_nbins_get(tcache->tcache_slow) &&
		    !tcache_bin_disabled(ind, &tcache->bins[ind],
		    tcache->tcache_slow)) && progress < batch) {
			if (bin == NULL) {
				bin = &tcache->bins[ind];
			}
			/*
			 * If we don't have a tcache bin, we don't want to
			 * immediately give up, because there's the possibility
			 * that the user explicitly requested to bypass the
			 * tcache, or that the user explicitly turned off the
			 * tcache; in such cases, we go through the slow path,
			 * i.e. the mallocx() call at the end of the while loop.
			 */
			if (bin != NULL) {
				size_t bin_batch = batch - progress;
				/*
				 * n can be less than bin_batch, meaning that
				 * the cache bin does not have enough memory.
				 * In such cases, we rely on the slow path,
				 * i.e. the mallocx() call at the end of the
				 * while loop, to fill in the cache, and in the
				 * next iteration of the while loop, the tcache
				 * will contain a lot of memory, and we can
				 * harvest them here.  Compared to the
				 * alternative approach where we directly go to
				 * the arena bins here, the overhead of our
				 * current approach should usually be minimal,
				 * since we never try to fetch more memory than
				 * what a slab contains via the tcache.  An
				 * additional benefit is that the tcache will
				 * not be empty for the next allocation request.
				 */
				size_t n = cache_bin_alloc_batch(bin, bin_batch,
				    ptrs + filled);
				if (config_stats) {
					bin->tstats.nrequests += n;
				}
				if (zero) {
					for (size_t i = 0; i < n; ++i) {
						memset(ptrs[filled + i], 0,
						    usize);
					}
				}
				if (config_prof && opt_prof
				    && unlikely(ind >= SC_NBINS)) {
					for (size_t i = 0; i < n; ++i) {
						prof_tctx_reset_sampled(tsd,
						    ptrs[filled + i]);
					}
				}
				progress += n;
				filled += n;
			}
		}

		/*
		 * For thread events other than prof sampling, trigger them as
		 * if there's a single allocation of size (n * usize).  This is
		 * fine because:
		 * (a) these events do not alter the allocation itself, and
		 * (b) it's possible that some event would have been triggered
		 *     multiple times, instead of only once, if the allocations
		 *     were handled individually, but it would do no harm (or
		 *     even be beneficial) to coalesce the triggerings.
		 */
		thread_alloc_event(tsd, progress * usize);

		if (progress < batch || prof_sample_event) {
			void *p = je_mallocx(size, flags);
			if (p == NULL) { /* OOM */
				break;
			}
			if (progress == batch) {
				assert(prof_sampled(tsd, p));
			}
			ptrs[filled++] = p;
		}
	}

label_done:
	check_entry_exit_locking(tsd_tsdn(tsd));
	LOG("core.batch_alloc.exit", "result: %zu", filled);
	return filled;
}